

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsRectVisible(ImVec2 *size)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ImRect *this;
  ImVec2 IVar3;
  undefined8 extraout_XMM0_Qb;
  ImGuiWindow *window;
  ImVec2 *lhs;
  ImVec2 local_28;
  ImRect local_20;
  ImGuiWindow *local_10;
  
  local_10 = GImGui->CurrentWindow;
  this = &local_10->ClipRect;
  lhs = &(local_10->DC).CursorPos;
  IVar3 = ::operator+(lhs,(ImVec2 *)0x1c8737);
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar1._0_4_ = IVar3.x;
  auVar1._4_4_ = IVar3.y;
  local_28 = (ImVec2)vmovlpd_avx(auVar1);
  ImRect::ImRect(&local_20,lhs,&local_28);
  bVar2 = ImRect::Overlaps(this,&local_20);
  return bVar2;
}

Assistant:

bool ImGui::IsRectVisible(const ImVec2& size)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    return window->ClipRect.Overlaps(ImRect(window->DC.CursorPos, window->DC.CursorPos + size));
}